

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringstream.cpp
# Opt level: O1

string * __thiscall
embree::StringStream::next_abi_cxx11_(string *__return_storage_ptr__,StringStream *this)

{
  pointer pcVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  uint *puVar5;
  runtime_error *this_00;
  long *plVar6;
  long *plVar7;
  Stream<int> *this_01;
  vector<char,_std::allocator<char>_> str;
  vector<char,_std::allocator<char>_> local_a8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  piVar4 = Stream<int>::peek((this->cin).ptr);
  if (*piVar4 != -1) {
    do {
      iVar2 = std::__cxx11::string::compare((char *)&this->endl);
      if ((iVar2 != 0) && (piVar4 = Stream<int>::peek((this->cin).ptr), *piVar4 == 10)) {
        Stream<int>::drop((this->cin).ptr);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar1 = (this->endl)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->endl)._M_string_length);
        return __return_storage_ptr__;
      }
      if ((this->multiLine == true) &&
         (piVar4 = Stream<int>::peek((this->cin).ptr), *piVar4 == 0x5c)) {
        Stream<int>::drop((this->cin).ptr);
        piVar4 = Stream<int>::peek((this->cin).ptr);
        this_01 = (this->cin).ptr;
        if (*piVar4 != 10) {
          Stream<int>::unget(this_01,1);
          goto LAB_001d65dd;
        }
      }
      else {
LAB_001d65dd:
        puVar5 = (uint *)Stream<int>::peek((this->cin).ptr);
        if ((0xff < (ulong)*puVar5) || (this->isSepMap[*puVar5] != true)) break;
        this_01 = (this->cin).ptr;
      }
      Stream<int>::drop(this_01);
      piVar4 = Stream<int>::peek((this->cin).ptr);
    } while (*piVar4 != -1);
  }
  local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (char *)0x0;
  local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (char *)0x0;
  std::vector<char,_std::allocator<char>_>::reserve(&local_a8,0x40);
  while (piVar4 = Stream<int>::peek((this->cin).ptr), *piVar4 != -1) {
    puVar5 = (uint *)Stream<int>::peek((this->cin).ptr);
    if (((ulong)*puVar5 < 0x100) && (this->isSepMap[*puVar5] != false)) break;
    uVar3 = Stream<int>::get((this->cin).ptr);
    if ((0xff < uVar3) || (this->isValidCharMap[uVar3] == false)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_68,'\x01');
      std::operator+(&local_48,"invalid character ",&local_68);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_48);
      local_88 = (long *)*plVar6;
      plVar7 = plVar6 + 2;
      if (local_88 == plVar7) {
        local_78 = *plVar7;
        lStack_70 = plVar6[3];
        local_88 = &local_78;
      }
      else {
        local_78 = *plVar7;
      }
      local_80 = plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::runtime_error::runtime_error(this_00,(string *)&local_88);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_88 = (long *)CONCAT71(local_88._1_7_,(char)uVar3);
    if (local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                (&local_a8,
                 (iterator)
                 local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,(char *)&local_88);
    }
    else {
      *local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_finish = (char)uVar3;
      local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
  }
  local_88 = (long *)((ulong)local_88 & 0xffffffffffffff00);
  if (local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
              (&local_a8,
               (iterator)
               local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,(char *)&local_88);
  }
  else {
    *local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
     _M_finish = '\0';
    local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,(allocator *)&local_88);
  if (local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringStream::next()
  {
    /* skip separators */
    while (cin->peek() != EOF) {
      if (endl != "" && cin->peek() == '\n') { cin->drop(); return endl; }
      if (multiLine && cin->peek() == '\\') {
        cin->drop();
        if (cin->peek() == '\n') { cin->drop(); continue; }
        cin->unget();
      }
      if (!isSeparator(cin->peek())) break;
      cin->drop();
    }

    /* parse everything until the next separator */
    std::vector<char> str; str.reserve(64);
    while (cin->peek() != EOF && !isSeparator(cin->peek())) {
      int c = cin->get();
      if (!isValidChar(c)) throw std::runtime_error("invalid character "+std::string(1,c)+" in input");
      str.push_back((char)c);
    }
    str.push_back(0);
    return std::string(str.data());
  }